

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall imrt::EvaluationFunction::generate_voxel_dose_functions(EvaluationFunction *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pdVar6;
  ostream *poVar7;
  long in_RDI;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  pair<std::_Rb_tree_const_iterator<double>,_bool> pVar8;
  int k_1;
  double cum;
  ofstream myfile_1;
  int o_1;
  double v;
  iterator __end2;
  iterator __begin2;
  set<double,_std::greater<double>,_std::allocator<double>_> *__range2;
  ofstream myfile;
  int k;
  set<double,_std::greater<double>,_std::allocator<double>_> dose;
  int o;
  set<double,_std::greater<double>,_std::allocator<double>_> *in_stack_fffffffffffffa38;
  double dVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffa48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffa50;
  value_type_conflict1 *in_stack_fffffffffffffa58;
  set<double,_std::greater<double>,_std::allocator<double>_> *in_stack_fffffffffffffa60;
  int local_56c;
  double local_568;
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [516];
  int local_2fc;
  double local_2f8;
  _Self local_2f0;
  _Self local_2e8;
  undefined1 *local_2e0;
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [512];
  _Base_ptr local_78;
  undefined1 local_70;
  int local_68;
  undefined8 local_58;
  double *local_50;
  double *local_48;
  undefined1 local_40 [52];
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x48); local_c = local_c + 1) {
    std::set<double,_std::greater<double>,_std::allocator<double>_>::set
              ((set<double,_std::greater<double>,_std::allocator<double>_> *)0x12eaa9);
    this_00 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(in_RDI + 0x28);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](this_00,(long)local_c);
    local_48 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](this_00,(long)local_c);
    local_50 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa38);
    local_58 = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               (double *)in_stack_fffffffffffffa40);
    local_68 = 0;
    while( true ) {
      iVar1 = local_68;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_c);
      if (*pvVar3 <= iVar1) break;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)local_c);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_68);
      pVar8 = std::set<double,_std::greater<double>,_std::allocator<double>_>::insert
                        (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      local_78 = (_Base_ptr)pVar8.first._M_node;
      local_70 = pVar8.second;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)local_c);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_68);
      if (*pvVar5 <= 150.0 && *pvVar5 != 150.0) {
        in_stack_fffffffffffffa60 =
             (set<double,_std::greater<double>,_std::allocator<double>_> *)
             std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x28),(long)local_c);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)local_c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_68);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa60,
                            (long)(int)*pvVar5);
        *pvVar5 = *pvVar5 + 1.0;
      }
      local_68 = local_68 + 1;
    }
    std::ofstream::ofstream(local_278);
    std::__cxx11::to_string((int)((ulong)in_RDI >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffa48._M_current,in_stack_fffffffffffffa40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa48._M_current,(char *)in_stack_fffffffffffffa40);
    std::ofstream::open(local_278,(_Ios_Openmode)local_298);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string(local_2d8);
    local_2e0 = local_40;
    local_2e8._M_node =
         (_Base_ptr)
         std::set<double,_std::greater<double>,_std::allocator<double>_>::begin
                   (in_stack_fffffffffffffa38);
    local_2f0._M_node =
         (_Base_ptr)
         std::set<double,_std::greater<double>,_std::allocator<double>_>::end
                   (in_stack_fffffffffffffa38);
    while( true ) {
      bVar2 = std::operator!=(&local_2e8,&local_2f0);
      if (!bVar2) break;
      pdVar6 = std::_Rb_tree_const_iterator<double>::operator*
                         ((_Rb_tree_const_iterator<double> *)0x12ed87);
      local_2f8 = *pdVar6;
      in_stack_fffffffffffffa58 =
           (value_type_conflict1 *)std::ostream::operator<<(local_278,local_2f8);
      std::ostream::operator<<(in_stack_fffffffffffffa58,std::endl<char,std::char_traits<char>>);
      std::_Rb_tree_const_iterator<double>::operator++
                ((_Rb_tree_const_iterator<double> *)in_stack_fffffffffffffa40);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_278);
    std::set<double,_std::greater<double>,_std::allocator<double>_>::~set
              ((set<double,_std::greater<double>,_std::allocator<double>_> *)0x12ee80);
  }
  for (local_2fc = 0; local_2fc < *(int *)(in_RDI + 0x48); local_2fc = local_2fc + 1) {
    std::ofstream::ofstream(local_500);
    std::__cxx11::to_string((int)((ulong)in_RDI >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffa48._M_current,in_stack_fffffffffffffa40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa48._M_current,(char *)in_stack_fffffffffffffa40);
    std::ofstream::open(local_500,(_Ios_Openmode)local_520);
    std::__cxx11::string::~string(local_520);
    std::__cxx11::string::~string(local_540);
    std::__cxx11::string::~string(local_560);
    local_568 = 0.0;
    for (local_56c = 0x95; -1 < local_56c; local_56c = local_56c + -1) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x28),(long)local_2fc);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_56c);
      local_568 = local_568 + *pvVar5;
      poVar7 = (ostream *)std::ostream::operator<<(local_500,local_56c + 1);
      in_stack_fffffffffffffa48._M_current = (double *)std::operator<<(poVar7,",");
      dVar9 = local_568;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_2fc);
      in_stack_fffffffffffffa40 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::ostream::operator<<(in_stack_fffffffffffffa48._M_current,dVar9 / (double)*pvVar3);
      std::ostream::operator<<(in_stack_fffffffffffffa40,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_500);
  }
  return;
}

Assistant:

void EvaluationFunction::generate_voxel_dose_functions (){

	for(int o=0; o<nb_organs; o++){
		std::set<double, std::greater<double> > dose;
		std::fill(voxel_dose[o].begin(), voxel_dose[o].end(), 0.0);
		for(int k=0; k<nb_voxels[o]; k++){

			dose.insert(Z[o][k]);
			if(Z[o][k]<150)
				voxel_dose[o][(int) Z[o][k]]+=1;
		}

		ofstream myfile;
		myfile.open ("plotter/organ_xls"+std::to_string(o)+".dat");
		for(auto v:dose){
			myfile << v << endl;
		}
		myfile.close();

	}


	for(int o=0; o<nb_organs; o++){
		ofstream myfile;
		myfile.open ("plotter/organ"+std::to_string(o)+".txt");

		double cum=0.0;
		for(int k=149; k>=0; k--){
			cum+= voxel_dose[o][k];
			myfile << k+1 << "," << cum/nb_voxels[o] << endl;
		}

		myfile.close();
	}
}